

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O2

bool __thiscall FConfigFile::DeleteCurrentSection(FConfigFile *this)

{
  FConfigSection *pFVar1;
  FConfigSection *pFVar2;
  FConfigSection *pFVar3;
  
  if (this->CurrentSection == (FConfigSection *)0x0) {
    return false;
  }
  ClearCurrentSection(this);
  pFVar1 = this->CurrentSection;
  pFVar2 = this->Sections;
  do {
    pFVar3 = pFVar2;
    if (pFVar3 == (FConfigSection *)0x0) break;
    pFVar2 = pFVar3->Next;
  } while (pFVar3->Next != pFVar1);
  pFVar3->Next = pFVar1->Next;
  if (this->LastSectionPtr == &pFVar1->Next) {
    this->LastSectionPtr = &pFVar3->Next;
  }
  FConfigSection::~FConfigSection(pFVar1);
  operator_delete(pFVar1,0x28);
  pFVar1 = pFVar3->Next;
  this->CurrentSection = pFVar1;
  return pFVar1 != (FConfigSection *)0x0;
}

Assistant:

bool FConfigFile::DeleteCurrentSection()
{
	if (CurrentSection != NULL)
	{
		FConfigSection *sec;

		ClearCurrentSection();

		// Find the preceding section.
		for (sec = Sections; sec != NULL && sec->Next != CurrentSection; sec = sec->Next)
		{ }

		sec->Next = CurrentSection->Next;
		if (LastSectionPtr == &CurrentSection->Next)
		{
			LastSectionPtr = &sec->Next;
		}

		delete CurrentSection;

		CurrentSection = sec->Next;
		return CurrentSection != NULL;
	}
	return false;
}